

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

bool SetUserDefinedDevice(char *id,CDevice **dev,CDevice *parent,aint ramtop)

{
  CDeviceDef *pCVar1;
  pointer ppCVar2;
  int iVar3;
  ulong uVar4;
  CDevice *device;
  char *pcVar5;
  pointer ppCVar6;
  long lVar7;
  pointer ppCVar8;
  
  ppCVar2 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  ppCVar6 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (long)uVar4 >> 5) {
    ppCVar6 = (pointer)((uVar4 & 0xffffffffffffffe0) +
                       (long)DefDevices.
                             super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl
                             .super__Vector_impl_data._M_start);
    lVar7 = ((long)uVar4 >> 5) + 1;
    ppCVar8 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
    do {
      iVar3 = strcasecmp(id,ppCVar8[-2]->ID);
      if (iVar3 == 0) {
        ppCVar8 = ppCVar8 + -2;
        goto LAB_0010b62b;
      }
      iVar3 = strcasecmp(id,ppCVar8[-1]->ID);
      if (iVar3 == 0) {
        ppCVar8 = ppCVar8 + -1;
        goto LAB_0010b62b;
      }
      iVar3 = strcasecmp(id,(*ppCVar8)->ID);
      if (iVar3 == 0) goto LAB_0010b62b;
      iVar3 = strcasecmp(id,ppCVar8[1]->ID);
      if (iVar3 == 0) {
        ppCVar8 = ppCVar8 + 1;
        goto LAB_0010b62b;
      }
      lVar7 = lVar7 + -1;
      ppCVar8 = ppCVar8 + 4;
    } while (1 < lVar7);
    uVar4 = (long)ppCVar2 - (long)ppCVar6;
  }
  lVar7 = (long)uVar4 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      if (lVar7 != 3) {
        return false;
      }
      iVar3 = strcasecmp(id,(*ppCVar6)->ID);
      ppCVar8 = ppCVar6;
      if (iVar3 == 0) goto LAB_0010b62b;
      ppCVar6 = ppCVar6 + 1;
    }
    iVar3 = strcasecmp(id,(*ppCVar6)->ID);
    ppCVar8 = ppCVar6;
    if (iVar3 == 0) goto LAB_0010b62b;
    ppCVar6 = ppCVar6 + 1;
  }
  iVar3 = strcasecmp(id,(*ppCVar6)->ID);
  ppCVar8 = ppCVar6;
  if (iVar3 != 0) {
    ppCVar8 = ppCVar2;
  }
LAB_0010b62b:
  if (ppCVar2 == ppCVar8) {
    return false;
  }
  pCVar1 = *ppCVar8;
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  device = (CDevice *)operator_new(0x2838);
  pcVar5 = pCVar1->ID;
  device->Next = (CDevice *)0x0;
  device->SlotsCount = 0;
  device->PagesCount = 0;
  device->Memory = (byte *)0x0;
  device->ZxRamTop = 0;
  device->CurrentSlot = 0;
  device->limitExceeded = false;
  device->previousSlotI = 0;
  device->previousSlotOpt = O_NONE;
  pcVar5 = strdup(pcVar5);
  device->ID = pcVar5;
  if (parent != (CDevice *)0x0) {
    parent->Next = device;
  }
  memset(device->Slots,0,0x2800);
  *dev = device;
  initRegularSlotDevice
            (device,pCVar1->SlotSize,pCVar1->SlotsCount,pCVar1->PagesCount,pCVar1->initialPages);
  return true;
}

Assistant:

static bool SetUserDefinedDevice(const char* id, CDevice** dev, CDevice* parent, aint ramtop) {
	auto findIt = std::find_if(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (DefDevices.end() == findIt) return false;	// not found
	const CDeviceDef & def = **findIt;
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice(def.getID(), parent);
	initRegularSlotDevice(*dev, def.SlotSize, def.SlotsCount, def.PagesCount, def.initialPages);
	return true;
}